

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_ntop.c
# Opt level: O2

char * inet_ntop4(uchar *src,char *dst,size_t size)

{
  size_t sVar1;
  int *piVar2;
  char tmp [16];
  
  tmp[0] = '\0';
  curl_msnprintf(tmp,0x10,"%d.%d.%d.%d",(ulong)*src,(ulong)src[1],(ulong)src[2],(uint)src[3]);
  sVar1 = strlen(tmp);
  if (sVar1 == 0 || size <= sVar1) {
    piVar2 = __errno_location();
    *piVar2 = 0x1c;
    dst = (char *)0x0;
  }
  else {
    strcpy(dst,tmp);
  }
  return dst;
}

Assistant:

static char *inet_ntop4 (const unsigned char *src, char *dst, size_t size)
{
  char tmp[sizeof("255.255.255.255")];
  size_t len;

  DEBUGASSERT(size >= 16);

  tmp[0] = '\0';
  (void)snprintf(tmp, sizeof(tmp), "%d.%d.%d.%d",
                 ((int)((unsigned char)src[0])) & 0xff,
                 ((int)((unsigned char)src[1])) & 0xff,
                 ((int)((unsigned char)src[2])) & 0xff,
                 ((int)((unsigned char)src[3])) & 0xff);

  len = strlen(tmp);
  if(len == 0 || len >= size) {
    errno = ENOSPC;
    return (NULL);
  }
  strcpy(dst, tmp);
  return dst;
}